

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_utils.c
# Opt level: O0

void VP8InitRandom(VP8Random *rg,float dithering)

{
  undefined4 *in_RDI;
  float in_XMM0_Da;
  undefined4 local_14;
  undefined4 local_10;
  
  memcpy(in_RDI + 2,kRandomTable,0xdc);
  *in_RDI = 0;
  in_RDI[1] = 0x1f;
  if (0.0 <= in_XMM0_Da) {
    if (in_XMM0_Da <= 1.0) {
      local_14 = (undefined4)(long)(in_XMM0_Da * 256.0);
    }
    else {
      local_14 = 0x100;
    }
    local_10 = local_14;
  }
  else {
    local_10 = 0;
  }
  in_RDI[0x39] = local_10;
  return;
}

Assistant:

void VP8InitRandom(VP8Random* const rg, float dithering) {
  memcpy(rg->tab, kRandomTable, sizeof(rg->tab));
  rg->index1 = 0;
  rg->index2 = 31;
  rg->amp = (dithering < 0.0) ? 0
          : (dithering > 1.0) ? (1 << VP8_RANDOM_DITHER_FIX)
          : (uint32_t)((1 << VP8_RANDOM_DITHER_FIX) * dithering);
}